

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O0

Node * __thiscall Parser::createAccessConstructorNode(Parser *this,Token *t)

{
  Node *token;
  Node *n;
  CompilationContext *in_stack_ffffffffffffffd8;
  Node *in_stack_ffffffffffffffe0;
  
  token = (Node *)operator_new(0x30);
  Node::Node(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(Token *)token);
  *(undefined4 *)&token->nodeType = 0x3a;
  return token;
}

Assistant:

Node * createAccessConstructorNode(Token & t)
  {
    Node * n = new Node(ctx, t);
    n->nodeType = PNT_ACCESS_CONSTRUCTOR;
    return n;
  }